

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm_debug.cpp
# Opt level: O0

void lvm_debug_p(void)

{
  ostream *poVar1;
  int local_10;
  int local_c;
  int i;
  int count;
  
  local_c = 0;
  for (local_10 = 0; local_10 < 8; local_10 = local_10 + 1) {
    local_c = local_c + 1;
    poVar1 = std::operator<<((ostream *)&std::cout,"R");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10);
    std::operator<<(poVar1,"--------->");
    printf("%08X\t",(ulong)*register_list[local_10]);
    if (local_c == 3) {
      local_c = 0;
      printf("\n");
    }
  }
  printf("IP--------->%08X\n",(ulong)registe_ptr->IP);
  printf("SP--------->%08X\t",(ulong)registe_ptr->SP);
  printf("BP--------->%08X\n",(ulong)registe_ptr->BP);
  printf("CS--------->%08X\n",(ulong)registe_ptr->CS);
  printf("DS--------->%08X\n",(ulong)registe_ptr->DS);
  printf("flag[0]--------->%02x\t",(ulong)(uint)(int)registe_ptr->flag[0]);
  printf("flag[1]--------->%02x\t",(ulong)(uint)(int)registe_ptr->flag[1]);
  printf("flag[14]--------->%02x\n",(ulong)(uint)(int)registe_ptr->flag[0xe]);
  return;
}

Assistant:

void lvm_debug_p() {
	int count{ 0 };
	for (int i = 0; i < 8; i++)
	{
		++count;
		std::cout << "R" << i << "--------->";
		printf("%08X	", *register_list[i]);
		if (count == 3) {
			count = 0;
			printf("\n");
		}
	}
	printf("IP--------->%08X\n", registe_ptr->IP);
	printf("SP--------->%08X	", registe_ptr->SP);
	printf("BP--------->%08X\n", registe_ptr->BP);
	printf("CS--------->%08X\n", registe_ptr->CS);
	printf("DS--------->%08X\n", registe_ptr->DS);
	printf("flag[0]--------->%02x	", registe_ptr->flag[0]);
	printf("flag[1]--------->%02x	", registe_ptr->flag[1]);
	printf("flag[14]--------->%02x\n", registe_ptr->flag[14]);
}